

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

deUint32 deqp::gles2::Functional::UniformCase::randomFeatures(deUint32 seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined1 local_1c [4];
  deUint32 result;
  Random rnd;
  deUint32 seed_local;
  
  rnd.m_rnd.z = seed;
  de::Random::Random((Random *)local_1c,seed);
  iVar7 = de::Random::getInt((Random *)local_1c,0,1);
  uVar1 = randomFeatures::arrayUsageChoices[iVar7];
  iVar7 = de::Random::getInt((Random *)local_1c,0,1);
  uVar2 = randomFeatures::uniformFuncChoices[iVar7];
  iVar7 = de::Random::getInt((Random *)local_1c,0,2);
  uVar3 = randomFeatures::arrayAssignChoices[iVar7];
  iVar7 = de::Random::getInt((Random *)local_1c,0,1);
  uVar4 = randomFeatures::uniformUsageChoices[iVar7];
  iVar7 = de::Random::getInt((Random *)local_1c,0,1);
  uVar5 = randomFeatures::booleanApiTypeChoices[iVar7];
  iVar7 = de::Random::getInt((Random *)local_1c,0,1);
  uVar6 = randomFeatures::uniformValueChoices[iVar7];
  de::Random::~Random((Random *)local_1c);
  return uVar6 | uVar1 | uVar2 | uVar3 | uVar4 | uVar5;
}

Assistant:

deUint32 UniformCase::randomFeatures (const deUint32 seed)
{
	static const deUint32 arrayUsageChoices[]		= { 0, FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX										};
	static const deUint32 uniformFuncChoices[]		= { 0, FEATURE_UNIFORMFUNC_VALUE												};
	static const deUint32 arrayAssignChoices[]		= { 0, FEATURE_ARRAYASSIGN_FULL,			FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	};
	static const deUint32 uniformUsageChoices[]		= { 0, FEATURE_UNIFORMUSAGE_EVERY_OTHER											};
	static const deUint32 booleanApiTypeChoices[]	= { 0, FEATURE_BOOLEANAPITYPE_INT												};
	static const deUint32 uniformValueChoices[]		= { 0, FEATURE_UNIFORMVALUE_ZERO												};

	Random rnd(seed);

	deUint32 result = 0;

#define ARRAY_CHOICE(ARR) ((ARR)[rnd.getInt(0, DE_LENGTH_OF_ARRAY(ARR)-1)])

	result |= ARRAY_CHOICE(arrayUsageChoices);
	result |= ARRAY_CHOICE(uniformFuncChoices);
	result |= ARRAY_CHOICE(arrayAssignChoices);
	result |= ARRAY_CHOICE(uniformUsageChoices);
	result |= ARRAY_CHOICE(booleanApiTypeChoices);
	result |= ARRAY_CHOICE(uniformValueChoices);

#undef ARRAY_CHOICE

	return result;
}